

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_3_3::DeepTiledInputFile::numLevels(DeepTiledInputFile *this)

{
  LevelMode LVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  element_type *peVar4;
  stringstream _iex_throw_s;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  LVar1 = levelMode((DeepTiledInputFile *)0xa816e1);
  if (LVar1 == RIPMAP_LEVELS) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"Error calling numLevels() on image file \"");
    pcVar3 = fileName((DeepTiledInputFile *)0xa8171d);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\" (numLevels() is not defined for files with RIPMAP level mode).");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::LogicExc::LogicExc((LogicExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::LogicExc::typeinfo,Iex_3_3::LogicExc::~LogicExc);
  }
  peVar4 = std::
           __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xa817c7);
  return peVar4->num_x_levels;
}

Assistant:

int
DeepTiledInputFile::numLevels () const
{
    if (levelMode () == RIPMAP_LEVELS)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Error calling numLevels() on image "
            "file \""
                << fileName ()
                << "\" "
                   "(numLevels() is not defined for files "
                   "with RIPMAP level mode).");

    return _data->num_x_levels;
}